

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_submodule * lys_sub_parse_fd(lys_module *module,int fd,LYS_INFORMAT format,unres_schema *unres)

{
  char *data;
  LY_ERR *pLVar1;
  char *addr;
  size_t length;
  lys_submodule *submodule;
  unres_schema *unres_local;
  LYS_INFORMAT format_local;
  int fd_local;
  lys_module *module_local;
  
  submodule = (lys_submodule *)unres;
  unres_local._0_4_ = format;
  unres_local._4_4_ = fd;
  _format_local = module;
  if (module == (lys_module *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x4cd,
                  "struct lys_submodule *lys_sub_parse_fd(struct lys_module *, int, LYS_INFORMAT, struct unres_schema *)"
                 );
  }
  if (-1 < fd) {
    data = (char *)lyp_mmap(fd,(long)(int)(uint)(format == LYS_IN_YANG),(size_t *)&addr);
    if (data == (char *)0xffffffffffffffff) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_ESYS;
      ly_log(LY_LLERR,"Mapping file descriptor into memory failed (%s()).","lys_sub_parse_fd");
      module_local = (lys_module *)0x0;
    }
    else if (data == (char *)0x0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EINVAL;
      ly_log(LY_LLERR,"Empty submodule schema file.");
      module_local = (lys_module *)0x0;
    }
    else {
      _format_local = lys_main_module(_format_local);
      if ((LYS_INFORMAT)unres_local == LYS_IN_YANG) {
        length = (size_t)yang_read_submodule(_format_local,data,0,(unres_schema *)submodule);
      }
      else {
        if ((LYS_INFORMAT)unres_local != LYS_IN_YIN) {
          pLVar1 = ly_errno_location();
          *pLVar1 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                 ,0x4e4);
          return (lys_submodule *)0x0;
        }
        length = (size_t)yin_read_submodule(_format_local,data,(unres_schema *)submodule);
      }
      lyp_munmap(data,(size_t)addr);
      module_local = (lys_module *)length;
    }
    return (lys_submodule *)module_local;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                ,0x4ce,
                "struct lys_submodule *lys_sub_parse_fd(struct lys_module *, int, LYS_INFORMAT, struct unres_schema *)"
               );
}

Assistant:

struct lys_submodule *
lys_sub_parse_fd(struct lys_module *module, int fd, LYS_INFORMAT format, struct unres_schema *unres)
{
    struct lys_submodule *submodule;
    size_t length;
    char *addr;

    assert(module);
    assert(fd >= 0);

    addr = lyp_mmap(fd, format == LYS_IN_YANG ? 1 : 0, &length);
    if (addr == MAP_FAILED) {
        LOGERR(LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        return NULL;
    } else if (!addr) {
        LOGERR(LY_EINVAL, "Empty submodule schema file.");
        return NULL;
    }

    /* get the main module */
    module = lys_main_module(module);

    switch (format) {
    case LYS_IN_YIN:
        submodule = yin_read_submodule(module, addr, unres);
        break;
    case LYS_IN_YANG:
        submodule = yang_read_submodule(module, addr, 0, unres);
        break;
    default:
        LOGINT;
        return NULL;
    }

    lyp_munmap(addr, length);
    return submodule;

}